

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

void __thiscall ON_EmbeddedFile::~ON_EmbeddedFile(ON_EmbeddedFile *this)

{
  CImpl *this_00;
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081e2b8;
  Clear(this);
  this_00 = this->m_impl;
  if (this_00 != (CImpl *)0x0) {
    _Var1._M_head_impl =
         (this_00->m_data).m_buffer._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var1._M_head_impl);
    }
    (this_00->m_data).m_buffer._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    ON_wString::~ON_wString(&this_00->m_orig_file);
    operator_delete(this_00,0x28);
  }
  this->m_impl = (CImpl *)0x0;
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00823f80;
  ON_wString::~ON_wString(&(this->super_ON_ModelComponent).m_component_name);
  ON_Object::~ON_Object((ON_Object *)this);
  return;
}

Assistant:

ON_EmbeddedFile::~ON_EmbeddedFile()
{
  Clear();

  delete m_impl;
  m_impl = nullptr;
}